

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg-queue.c
# Opt level: O3

ndn_msg * ndn_msgqueue_post(void *target,ndn_msg_callback reason,size_t param_length,void *param)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  ndn_msg_t *pnVar4;
  
  uVar1 = param_length + 0x18;
  ndn_msgqueue_empty();
  pnVar4 = ptail;
  uVar2 = (long)&psplit - (long)ptail;
  if (ptail < pfront) {
    uVar2 = (long)&pfront->obj + ~(ulong)ptail;
  }
  if ((pfront < ptail) && (uVar2 < param_length + 0x30)) {
    if (uVar2 < 0x18 || (long)&pfront[-0xcff9].func <= (long)(int)uVar1) {
      return (ndn_msg *)0x0;
    }
    ptail->func = (ndn_msg_callback)0xffffffffffffffff;
    pnVar4->length = uVar2;
    puVar3 = msg_queue;
  }
  else {
    if (uVar2 < uVar1) {
      return (ndn_msg *)0x0;
    }
    puVar3 = (uint8_t *)ptail;
    if (pfront == (ndn_msg_t *)msg_queue && uVar2 == uVar1) {
      return (ndn_msg *)0x0;
    }
  }
  ((ndn_msg_t *)puVar3)->obj = target;
  ((ndn_msg_t *)puVar3)->func = reason;
  ((ndn_msg_t *)puVar3)->length = uVar1;
  if (param_length != 0) {
    memcpy((ndn_msg_t *)((long)puVar3 + 0x18),param,param_length);
  }
  pnVar4 = (ndn_msg_t *)((long)&((ndn_msg_t *)((long)puVar3 + 0x18))->obj + param_length);
  ptail = (ndn_msg_t *)msg_queue;
  if (pnVar4 < &psplit) {
    ptail = pnVar4;
  }
  return (ndn_msg *)puVar3;
}

Assistant:

struct ndn_msg*
ndn_msgqueue_post(void *target,
                  ndn_msg_callback reason,
                  size_t param_length,
                  void *param)
{
  size_t len = param_length + sizeof(ndn_msg_t);
  size_t space;
  ndn_msg_t* ret;

  // defrag the memory
  ndn_msgqueue_empty();

  if(pfront > ptail) {
    // -1 is to prevent (ptail == pfront) after call
    space = ((uint8_t*)pfront) - ((uint8_t*)ptail) - 1;
  } else {
    space = (&msg_queue[NDN_MSGQUEUE_SIZE] - ((uint8_t*)ptail));
  }

  // After tail?
  if(pfront >= ptail || space >= len + sizeof(ndn_msg_t)){
    // No-padding (= is to prevent ptail == pfront after call)
    if(space < len || (space == len && pfront == (ndn_msg_t*)&msg_queue))
      return NULL;
  } else {
    // Padding & rewind (= is to prevent ptail == pfront after call)
    if(((uint8_t*)pfront) - &msg_queue[0] <= (int) len)
      return NULL;

    if(space >= sizeof(ndn_msg_t)){
      ptail->func = NDN_MSG_PADDING;
      ptail->length = space;
      ptail = (ndn_msg_t*)&msg_queue[0];
    }else{
      // This should never happen
      return NULL;
    }
  }

  ptail->obj = target;
  ptail->func = reason;
  ptail->length = len;
  if(param_length > 0){
    memcpy(ptail->param, param, param_length);
  }

  ret = ptail;
  MSGQUEUE_NEXT(ptail);

  return ret;
}